

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::ApiCase::iterate(ApiCase *this)

{
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  (this->super_CallLogWrapper).m_enableLog = true;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  return STOP;
}

Assistant:

ApiCase::IterateResult ApiCase::iterate (void)
{
	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Enable call logging.
	enableLogging(true);

	// Run test.
	test();

	return STOP;
}